

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

int __thiscall
glcts::TessellationShaderTCTETests::init(TessellationShaderTCTETests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2e0);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"data_pass_through",
             "Verifies data is correctly passed down the VS->TC->TS->(GS) pipeline.");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTCTEDataPassThrough_0214eaa8;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x400000000;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2d0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"gl_in",
             "Verifies values of gl_in[] in a tessellation evaluation shader are taken from output variables of a tessellation control shaderif one is present."
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0214eb98
  ;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx + 4) = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2e8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,
             "gl_MaxPatchVertices_Position_PointSize",
             "Verifies gl_Position and gl_PointSize (if supported) are set to correct values in TE stage. Checks if up to gl_MaxPatchVertices input block values can be accessed from TE stage. Also verifies if TC/TE stage properties can be correctly queried for both regular and separate program objects."
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize_0214ebd0;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_testCtx = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  pTVar1[1].super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"gl_PatchVerticesIn",
             "Verifies gl_PatchVerticesIn size is valid in a tessellation evaluation shader and corresponds to the value configured in a tessellation control shader (should one be present) or to the default value, as set with glPatchParameteriEXT() call"
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTCTEgl_PatchVerticesIn_0214ec90;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2d8);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"gl_tessLevel",
             "Verifies gl_TessLevelOuter and gl_TessLevelInner patch variable values in a tessellation evaluation shader are valid and correspondto values configured in a tessellation control shader (should one be present) or to the default values, as set with glPatchParameterfv() calls"
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTCTEgl_TessLevel_0214ec48;
  pTVar1[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar1[1].super_TestCase.super_TestNode.m_name._M_string_length = 0;
  *(undefined4 *)&pTVar1[1].super_TestCase.super_TestNode.m_name.field_2 = 0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void TessellationShaderTCTETests::init(void)
{
	addChild(new glcts::TessellationShaderTCTEDataPassThrough(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_in(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_PatchVerticesIn(m_context, m_extParams));
	addChild(new glcts::TessellationShaderTCTEgl_TessLevel(m_context, m_extParams));
}